

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  Module *this_00;
  Location local_b8;
  undefined1 local_98 [8];
  string_view module_name_local;
  undefined1 local_40 [8];
  string_view field_name_local;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_28;
  
  field_name_local.data_ = (char *)field_name.size_;
  local_40 = (undefined1  [8])field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  local_98 = (undefined1  [8])module_name.data_;
  MakeUnique<wabt::FuncImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_98);
  std::__cxx11::string::operator=
            ((string *)
             &((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
              module_name,(string *)&module_name_local.size_);
  std::__cxx11::string::~string((string *)&module_name_local.size_);
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_40);
  std::__cxx11::string::operator=
            ((string *)
             &((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
              field_name,(string *)&module_name_local.size_);
  std::__cxx11::string::~string((string *)&module_name_local.size_);
  ((local_28._M_head_impl)->func).decl.has_func_type = true;
  GetLocation(&local_b8,this);
  Var::Var((Var *)&module_name_local.size_,sig_index,&local_b8);
  Var::operator=(&((local_28._M_head_impl)->func).decl.type_var,(Var *)&module_name_local.size_);
  Var::~Var((Var *)&module_name_local.size_);
  FuncSignature::operator=
            (&((local_28._M_head_impl)->func).decl.sig,
             &(this->module_->func_types).
              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
              super__Vector_impl_data._M_start[sig_index]->sig);
  this_00 = this->module_;
  GetLocation((Location *)&module_name_local.size_,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
            ((wabt *)&field_name_local.size_,
             (unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)&local_28,
             (Location *)&module_name_local.size_);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&field_name_local.size_);
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  field_name_local.size_ = 0;
  if (local_28._M_head_impl != (FuncImport *)0x0) {
    (*((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import._vptr_Import
      [1])();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    string_view module_name,
                                    string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = MakeUnique<FuncImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->func.decl.has_func_type = true;
  import->func.decl.type_var = Var(sig_index, GetLocation());
  import->func.decl.sig = module_->func_types[sig_index]->sig;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}